

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

boolean encode_mcu_DC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  huff_entropy_ptr entropy;
  jpeg_destination_mgr *pjVar3;
  jpeg_component_info *pjVar4;
  jpeg_error_mgr *pjVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  
  entropy = (huff_entropy_ptr)cinfo->entropy;
  iVar1 = cinfo->Al;
  pjVar3 = cinfo->dest;
  entropy->next_output_byte = pjVar3->next_output_byte;
  entropy->free_in_buffer = pjVar3->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy->restarts_to_go == 0)) {
    emit_restart_e(entropy,entropy->next_restart_num);
  }
  for (lVar10 = 0; lVar10 < cinfo->blocks_in_MCU; lVar10 = lVar10 + 1) {
    iVar2 = cinfo->MCU_membership[lVar10];
    iVar6 = (int)(*MCU_data[lVar10])[0] >> ((byte)iVar1 & 0x1f);
    pjVar4 = cinfo->cur_comp_info[iVar2];
    uVar8 = iVar6 - (entropy->saved).last_dc_val[iVar2];
    (entropy->saved).last_dc_val[iVar2] = iVar6;
    uVar7 = -uVar8;
    if (0 < (int)uVar8) {
      uVar7 = uVar8;
    }
    lVar9 = 0;
    for (; uVar7 != 0; uVar7 = uVar7 >> 1) {
      lVar9 = lVar9 + 1;
    }
    uVar7 = (uint)lVar9;
    if (0xb < uVar7) {
      pjVar5 = cinfo->err;
      pjVar5->msg_code = 6;
      (*pjVar5->error_exit)((j_common_ptr)cinfo);
    }
    iVar2 = pjVar4->dc_tbl_no;
    if (entropy->gather_statistics == 0) {
      emit_bits_e(entropy,entropy->dc_derived_tbls[iVar2]->ehufco[lVar9],
                  (int)entropy->dc_derived_tbls[iVar2]->ehufsi[lVar9]);
    }
    else {
      entropy->dc_count_ptrs[iVar2][lVar9] = entropy->dc_count_ptrs[iVar2][lVar9] + 1;
    }
    if (uVar7 != 0) {
      emit_bits_e(entropy,((int)uVar8 >> 0x1f) + uVar8,uVar7);
    }
  }
  pjVar3 = cinfo->dest;
  pjVar3->next_output_byte = entropy->next_output_byte;
  pjVar3->free_in_buffer = entropy->free_in_buffer;
  uVar7 = cinfo->restart_interval;
  if (uVar7 != 0) {
    uVar8 = entropy->restarts_to_go;
    if (entropy->restarts_to_go == 0) {
      entropy->next_restart_num = entropy->next_restart_num + 1U & 7;
      uVar8 = uVar7;
    }
    entropy->restarts_to_go = uVar8 - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_first (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int temp, temp2;
  register int nbits;
  int blkn, ci;
  int Al = cinfo->Al;
  JBLOCKROW block;
  jpeg_component_info * compptr;
  ISHIFT_TEMPS

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart_e(entropy, entropy->next_restart_num);

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Compute the DC value after the required point transform by Al.
     * This is simply an arithmetic right shift.
     */
    temp2 = IRIGHT_SHIFT((int) ((*block)[0]), Al);

    /* DC differences are figured on the point-transformed values. */
    temp = temp2 - entropy->saved.last_dc_val[ci];
    entropy->saved.last_dc_val[ci] = temp2;

    /* Encode the DC coefficient difference per section G.1.2.1 */
    temp2 = temp;
    if (temp < 0) {
      temp = -temp;		/* temp is abs value of input */
      /* For a negative input, want temp2 = bitwise complement of abs(input) */
      /* This code assumes we are on a two's complement machine */
      temp2--;
    }
    
    /* Find the number of bits needed for the magnitude of the coefficient */
    nbits = 0;
    while (temp) {
      nbits++;
      temp >>= 1;
    }
    /* Check for out-of-range coefficient values.
     * Since we're encoding a difference, the range limit is twice as much.
     */
    if (nbits > MAX_COEF_BITS+1)
      ERREXIT(cinfo, JERR_BAD_DCT_COEF);
    
    /* Count/emit the Huffman-coded symbol for the number of bits */
    emit_dc_symbol(entropy, compptr->dc_tbl_no, nbits);
    
    /* Emit that number of bits of the value, if positive, */
    /* or the complement of its magnitude, if negative. */
    if (nbits)			/* emit_bits rejects calls with size 0 */
      emit_bits_e(entropy, (unsigned int) temp2, nbits);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}